

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
KickExemptIRCCommand::trigger
          (KickExemptIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name;
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  Server **server;
  long *plVar4;
  uint uVar5;
  string local_b8;
  string setter;
  long *local_78;
  long *local_70;
  string_view nick_local;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  
  pcVar2 = channel._M_str;
  sVar3 = channel._M_len;
  setter._M_dataplus._M_p = (pointer)parameters._M_len;
  setter._M_string_length = (size_type)parameters._M_str;
  local_b8._M_dataplus._M_p = (pointer)0x2;
  local_b8._M_string_length = 0x13bb6d;
  nick_local._M_len = nick._M_len;
  nick_local._M_str = nick._M_str;
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&command_split,(basic_string_view<char,_std::char_traits<char>_> *)&setter,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_b8);
  name._M_str = command_split.first._M_str;
  name._M_len = command_split.first._M_len;
  if (command_split.first._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,nick._M_len,nick._M_str,0x3f,
               "Error: Too Few Parameters. Syntax: KickExempt <Player> [Reason]");
  }
  lVar1 = Jupiter::IRC::Client::getChannel(source,sVar3,pcVar2);
  if (lVar1 != 0) {
    RenX::getCore();
    Jupiter::IRC::Client::Channel::getType();
    RenX::Core::getServers((int)&local_78);
    if (local_78 == local_70) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar3,pcVar2,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&setter,&nick_local,(allocator<char> *)&local_b8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&setter,"@IRC");
      uVar5 = 0;
      for (plVar4 = local_78; plVar4 != local_70; plVar4 = plVar4 + 1) {
        if (*plVar4 != 0) {
          lVar1 = RenX::Server::getPlayerByPartName
                            (*plVar4,command_split.first._M_len,command_split.first._M_str);
          if (lVar1 != 0) {
            RenX::ExemptionDatabase::add
                      (RenX::exemptionDatabase,*plVar4,lVar1,setter._M_string_length,
                       setter._M_dataplus._M_p,0,(uint)(*(long *)(lVar1 + 0xe8) == 0) << 6 | 6);
            uVar5 = uVar5 + 1;
          }
        }
      }
      if (uVar5 == 0) {
        player_not_found_message_abi_cxx11_(&local_b8,name);
        Jupiter::IRC::Client::sendMessage
                  (source,sVar3,pcVar2,local_b8._M_string_length,local_b8._M_dataplus._M_p);
      }
      else {
        string_printf_abi_cxx11_(&local_b8,"%u players added.",(ulong)uVar5);
        Jupiter::IRC::Client::sendMessage
                  (source,sVar3,pcVar2,local_b8._M_string_length,local_b8._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&setter);
    }
    std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
              ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_78);
  }
  return;
}

Assistant:

void KickExemptIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	std::string_view target_name = command_split.first;
	if (target_name.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: KickExempt <Player> [Reason]"sv);
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	RenX::PlayerInfo *player;
	unsigned int exemptions = 0;
	std::string setter{ nick };
	setter += "@IRC";
	for (const auto& server : servers) {
		if (server != nullptr) {
			player = server->getPlayerByPartName(target_name);
			if (player != nullptr) {
				if (player->steamid != 0LL) {
					RenX::exemptionDatabase->add(*server, *player, setter, std::chrono::seconds::zero(), RenX::ExemptionDatabase::Entry::FLAG_TYPE_BAN | RenX::ExemptionDatabase::Entry::FLAG_TYPE_KICK);
				}
				else {
					RenX::exemptionDatabase->add(*server, *player, setter, std::chrono::seconds::zero(), RenX::ExemptionDatabase::Entry::FLAG_TYPE_BAN | RenX::ExemptionDatabase::Entry::FLAG_TYPE_KICK | RenX::ExemptionDatabase::Entry::FLAG_USE_IP);
				}
				++exemptions;
			}
		}
	}
	if (exemptions == 0) {
		source->sendMessage(channel, player_not_found_message(target_name));
	}
	else {
		source->sendMessage(channel, string_printf("%u players added.", exemptions));
	}
}